

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::CreateAttributesDecoder
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          int32_t att_decoder_id)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  MeshEdgebreakerDecoder *pMVar6;
  DecoderBuffer *pDVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  pointer pAVar11;
  Mesh *pMVar12;
  TraversalObserver traversal_observer;
  bool bVar13;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> this_00;
  tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  this_01;
  MeshAttributeIndicesEncodingData *pMVar14;
  byte bVar15;
  int *piVar16;
  ulong uVar17;
  CornerTable *corner_table;
  AttTraverser att_traverser;
  __uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> local_f8;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  local_f0;
  CornerTable *local_e8;
  MeshAttributeIndicesEncodingData *pMStack_e0;
  Mesh *local_d8;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> _Stack_d0;
  undefined1 local_c8 [136];
  pointer pIStack_40;
  pointer local_38;
  
  pMVar6 = this->decoder_;
  pDVar7 = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  lVar8 = pDVar7->data_size_;
  lVar9 = pDVar7->pos_;
  lVar1 = lVar9 + 1;
  if (lVar8 < lVar1) {
    return false;
  }
  pcVar10 = pDVar7->data_;
  bVar3 = pcVar10[lVar9];
  pDVar7->pos_ = lVar1;
  lVar2 = lVar9 + 2;
  if (lVar8 < lVar2) {
    return false;
  }
  cVar4 = pcVar10[lVar1];
  pDVar7->pos_ = lVar2;
  if ((char)bVar3 < '\0') {
    if (-1 < this->pos_data_decoder_id_) {
      return false;
    }
    piVar16 = &this->pos_data_decoder_id_;
  }
  else {
    pAVar11 = (this->attribute_data_).
              super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = ((long)(this->attribute_data_).
                    super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11 >> 6) *
             -0x3333333333333333;
    if (uVar17 < bVar3 || uVar17 - bVar3 == 0) {
      return false;
    }
    if (-1 < *(int *)((long)&pAVar11->decoder_id + (ulong)((uint)bVar3 * 0x140))) {
      return false;
    }
    piVar16 = (int *)((long)&pAVar11->decoder_id + (ulong)((uint)bVar3 * 0x140));
  }
  *piVar16 = att_decoder_id;
  uVar5._0_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar5._1_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  if ((ushort)(uVar5 << 8 | uVar5 >> 8) < 0x102) {
    if (cVar4 != '\0') {
      if ((char)bVar3 < '\0') {
        return false;
      }
      goto LAB_001274b7;
    }
    bVar15 = 0;
  }
  else {
    if (lVar8 < lVar9 + 3) {
      return false;
    }
    bVar15 = pcVar10[lVar2];
    pDVar7->pos_ = lVar9 + 3;
    if (1 < bVar15) {
      return false;
    }
    if (cVar4 != '\0') {
      if (bVar15 != 0) {
        return false;
      }
      if ((char)bVar3 < '\0') {
        return false;
      }
LAB_001274b7:
      pMVar12 = (pMVar6->super_MeshDecoder).mesh_;
      pAVar11 = (this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar14 = (MeshAttributeIndicesEncodingData *)
                ((long)&(pAVar11->encoding_data).encoded_attribute_value_index_to_corner_map.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                + (ulong)((uint)bVar3 * 0x140));
      corner_table = (CornerTable *)
                     ((long)&(pAVar11->connectivity_data).is_edge_on_seam_.
                             super__Bvector_base<std::allocator<bool>_> +
                     (ulong)((uint)bVar3 * 0x140));
      this_00._M_head_impl = (PointsSequencer *)operator_new(0xc0);
      *(vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        **)((long)this_00._M_head_impl + 8) =
           (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            *)0x0;
      *(undefined ***)this_00._M_head_impl = &PTR__MeshTraversalSequencer_001d9db8;
      (((_Bit_iterator *)((long)this_00._M_head_impl + 0x50))->super__Bit_iterator_base)._M_p =
           (_Bit_type *)0x0;
      *(uint *)((long)this_00._M_head_impl + 0x58) = 0;
      (((_Bit_iterator *)((long)this_00._M_head_impl + 0x78))->super__Bit_iterator_base)._M_p =
           (_Bit_type *)0x0;
      *(uint *)((long)this_00._M_head_impl + 0x80) = 0;
      *(_Bit_pointer *)((long)this_00._M_head_impl + 0x88) = (_Bit_pointer)0x0;
      *(CornerTable **)((long)this_00._M_head_impl + 0x18) = (CornerTable *)0x0;
      ((MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *)
      ((long)this_00._M_head_impl + 0x20))->att_connectivity_ = (MeshAttributeCornerTable *)0x0;
      *(MeshAttributeIndicesEncodingData **)((long)this_00._M_head_impl + 0x28) =
           (MeshAttributeIndicesEncodingData *)0x0;
      *(Mesh **)((long)this_00._M_head_impl + 0x30) = (Mesh *)0x0;
      *(PointsSequencer **)((long)this_00._M_head_impl + 0x38) = (PointsSequencer *)0x0;
      (((vector<bool,_std::allocator<bool>_> *)((long)this_00._M_head_impl + 0x40))->
      super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(uint *)((long)this_00._M_head_impl + 0x48) = 0;
      *(_Bit_pointer *)((long)this_00._M_head_impl + 0x60) = (_Bit_pointer)0x0;
      (((vector<bool,_std::allocator<bool>_> *)((long)this_00._M_head_impl + 0x68))->
      super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(uint *)((long)this_00._M_head_impl + 0x70) = 0;
      (((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
         *)((long)this_00._M_head_impl + 0x10))->
      super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      )._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_001d9be8;
      (((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         *)((long)this_00._M_head_impl + 0x90))->
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(pointer *)((long)this_00._M_head_impl + 0x98) = (pointer)0x0;
      *(pointer *)((long)this_00._M_head_impl + 0xa0) = (pointer)0x0;
      *(Mesh **)((long)this_00._M_head_impl + 0xa8) = pMVar12;
      *(MeshAttributeIndicesEncodingData **)((long)this_00._M_head_impl + 0xb0) = pMVar14;
      *(vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        **)((long)this_00._M_head_impl + 0xb8) =
           (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)0x0;
      local_c8._64_8_ = (_Bit_type *)0x0;
      local_c8._72_4_ = 0;
      local_c8._104_8_ = (pointer)0x0;
      local_c8._112_4_ = 0;
      local_c8._120_8_ = (_Bit_pointer)0x0;
      local_c8._8_8_ = (CornerTable *)0x0;
      local_c8._16_8_ =
           (__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>)0x0;
      local_c8._24_8_ = (MeshAttributeIndicesEncodingData *)0x0;
      local_c8._32_8_ = (Mesh *)0x0;
      local_c8._40_8_ = (PointsSequencer *)0x0;
      local_c8._48_8_ = (_Bit_type *)0x0;
      local_c8._56_4_ = 0;
      local_c8._80_8_ = (pointer)0x0;
      local_c8._88_8_ = (pointer)0x0;
      local_c8._96_4_ = 0;
      local_c8._0_8_ = &PTR__DepthFirstTraverser_001d9be8;
      local_c8._128_8_ = (pointer)0x0;
      pIStack_40 = (pointer)0x0;
      local_38 = (pointer)0x0;
      traversal_observer.encoding_data_ = pMVar14;
      traversal_observer.att_connectivity_ = corner_table;
      traversal_observer.mesh_ = pMVar12;
      traversal_observer.sequencer_ = this_00._M_head_impl;
      local_e8 = corner_table;
      pMStack_e0 = pMVar14;
      local_d8 = pMVar12;
      _Stack_d0._M_head_impl = this_00._M_head_impl;
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::Init((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              *)local_c8,corner_table,traversal_observer);
      MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
      ::SetTraverser((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                      *)this_00._M_head_impl,
                     (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                      *)local_c8);
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::~DepthFirstTraverser
                ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  *)local_c8);
      goto LAB_0012763d;
    }
  }
  if (-1 < (char)bVar3) {
    (&((this->attribute_data_).
       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
       ._M_impl.super__Vector_impl_data._M_start)->is_connectivity_used)[(uint)bVar3 * 0x140] =
         false;
  }
  if (bVar15 == 1) {
    CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
              ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)local_c8,
               (MeshAttributeIndicesEncodingData *)this);
  }
  else {
    CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
              ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)local_c8,
               (MeshAttributeIndicesEncodingData *)this);
  }
  this_00._M_head_impl = (PointsSequencer *)local_c8._0_8_;
  if ((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
       *)local_c8._0_8_ ==
      (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
       *)0x0) {
    return false;
  }
LAB_0012763d:
  this_01.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )operator_new(0x80);
  local_f8._M_t.
  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>.
  super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
       (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
       (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
       this_00._M_head_impl;
  SequentialAttributeDecodersController::SequentialAttributeDecodersController
            ((SequentialAttributeDecodersController *)
             this_01.
             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl,
             (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             &local_f8);
  if ((_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
      local_f8._M_t.
      super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
      .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl != (PointsSequencer *)0x0
     ) {
    (**(code **)(*(long *)local_f8._M_t.
                          super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                          .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl + 8))
              ();
  }
  local_f8._M_t.
  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>.
  super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
       (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
       (_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)0x0
  ;
  local_f0._M_t.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )(tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          )this_01.
           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
  bVar13 = PointCloudDecoder::SetAttributesDecoder
                     ((PointCloudDecoder *)this->decoder_,att_decoder_id,
                      (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                       *)&local_f0);
  if ((_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
       )local_f0._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl !=
      (AttributesDecoderInterface *)0x0) {
    (**(code **)(*(long *)local_f0._M_t.
                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                          _M_head_impl + 8))();
    return bVar13;
  }
  return bVar13;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::CreateAttributesDecoder(
    int32_t att_decoder_id) {
  int8_t att_data_id;
  if (!decoder_->buffer()->Decode(&att_data_id)) {
    return false;
  }
  uint8_t decoder_type;
  if (!decoder_->buffer()->Decode(&decoder_type)) {
    return false;
  }

  if (att_data_id >= 0) {
    if (att_data_id >= attribute_data_.size()) {
      return false;  // Unexpected attribute data.
    }

    // Ensure that the attribute data is not mapped to a different attributes
    // decoder already.
    if (attribute_data_[att_data_id].decoder_id >= 0) {
      return false;
    }

    attribute_data_[att_data_id].decoder_id = att_decoder_id;
  } else {
    // Assign the attributes decoder to |pos_encoding_data_|.
    if (pos_data_decoder_id_ >= 0) {
      return false;  // Some other decoder is already using the data. Error.
    }
    pos_data_decoder_id_ = att_decoder_id;
  }

  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  if (decoder_->bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 2)) {
    uint8_t traversal_method_encoded;
    if (!decoder_->buffer()->Decode(&traversal_method_encoded)) {
      return false;
    }
    // Check that decoded traversal method is valid.
    if (traversal_method_encoded >= NUM_TRAVERSAL_METHODS) {
      return false;
    }
    traversal_method =
        static_cast<MeshTraversalMethod>(traversal_method_encoded);
  }

  const Mesh *mesh = decoder_->mesh();
  std::unique_ptr<PointsSequencer> sequencer;

  if (decoder_type == MESH_VERTEX_ATTRIBUTE) {
    // Per-vertex attribute decoder.

    MeshAttributeIndicesEncodingData *encoding_data = nullptr;
    if (att_data_id < 0) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;
      // Mark the attribute connectivity data invalid to ensure it's not used
      // later on.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else {
      return false;  // Unsupported method
    }
  } else {
    if (traversal_method != MESH_TRAVERSAL_DEPTH_FIRST) {
      return false;  // Unsupported method.
    }
    if (att_data_id < 0) {
      return false;  // Attribute data must be specified.
    }

    // Per-corner attribute decoder.

    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh, encoding_data));

    AttObserver att_observer(corner_table, mesh, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  std::unique_ptr<SequentialAttributeDecodersController> att_controller(
      new SequentialAttributeDecodersController(std::move(sequencer)));

  return decoder_->SetAttributesDecoder(att_decoder_id,
                                        std::move(att_controller));
}